

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O3

size_t bssl::dtls_max_seal_overhead(SSL *ssl,uint16_t epoch)

{
  byte bVar1;
  DTLS1_STATE *pDVar2;
  uint16_t uVar3;
  size_t sVar4;
  long lVar5;
  DTLSWriteEpoch *pDVar6;
  
  pDVar2 = ssl->d1;
  if (*(uint16_t *)((long)&(pDVar2->write_epoch).next_record.combined_ + 6) == epoch) {
    pDVar6 = &pDVar2->write_epoch;
LAB_00172005:
    if (ssl->s3->version == 0) {
      lVar5 = 0xd;
    }
    else {
      uVar3 = ssl_protocol_version(ssl);
      lVar5 = 0xd;
      if (epoch != 0) {
        lVar5 = (ulong)(uVar3 < 0x304) * 8 + 5;
      }
    }
    sVar4 = SSLAEADContext::MaxOverhead
                      ((pDVar6->aead)._M_t.
                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl);
    sVar4 = sVar4 + lVar5;
    if (ssl->s3->version != 0) {
      uVar3 = ssl_protocol_version(ssl);
      sVar4 = sVar4 + (epoch != 0 && 0x303 < uVar3);
    }
  }
  else {
    bVar1 = (pDVar2->extra_write_epochs).size_;
    if (bVar1 == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = 0;
      lVar5 = 0;
      do {
        pDVar6 = *(DTLSWriteEpoch **)((pDVar2->extra_write_epochs).storage_ + lVar5);
        if (*(uint16_t *)((long)&(pDVar6->next_record).combined_ + 6) == epoch) goto LAB_00172005;
        lVar5 = lVar5 + 8;
      } while ((ulong)bVar1 * 8 != lVar5);
    }
  }
  return sVar4;
}

Assistant:

size_t dtls_max_seal_overhead(const SSL *ssl, uint16_t epoch) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t ret = dtls_record_header_write_len(ssl, epoch) +
               write_epoch->aead->MaxOverhead();
  if (use_dtls13_record_header(ssl, epoch)) {
    // Add 1 byte for the encrypted record type.
    ret++;
  }
  return ret;
}